

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_inl.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
MapField<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::SyncMapWithRepeatedFieldNoLock
          (MapField<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *this)

{
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  Rep *pRVar2;
  LogMessage *other;
  Value *from;
  key_type *key;
  Value *this_00;
  void **ppvVar3;
  void **ppvVar4;
  LogMessage local_70;
  LogFinisher local_31;
  
  pRVar1 = (this->
           super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
           ).super_MapFieldBase.repeated_field_;
  if (pRVar1 == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/map_field_inl.h"
               ,0x141);
    other = LogMessage::operator<<
                      (&local_70,"CHECK failed: this->MapFieldBase::repeated_field_ != NULL: ");
    LogFinisher::operator=(&local_31,other);
    LogMessage::~LogMessage(&local_70);
  }
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
  ::clear(&(this->impl_).map_);
  pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
  ppvVar4 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar4 = (void **)0x0;
  }
  if (((long)(pRVar1->super_RepeatedPtrFieldBase).current_size_ & 0x1fffffffffffffffU) != 0) {
    do {
      from = (Value *)(**(code **)(**ppvVar4 + 0xa8))();
      key = (key_type *)(**(code **)(**ppvVar4 + 0xa0))();
      this_00 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                ::operator[](&(this->impl_).map_,key);
      if (from != this_00) {
        Value::Clear(this_00);
        Value::MergeFrom(this_00,from);
      }
      ppvVar4 = ppvVar4 + 1;
      pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
      ppvVar3 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar3 = (void **)0x0;
      }
    } while (ppvVar4 != ppvVar3 + (pRVar1->super_RepeatedPtrFieldBase).current_size_);
  }
  return;
}

Assistant:

void MapField<Derived, Key, T, kKeyFieldType, kValueFieldType,
              default_enum_value>::SyncMapWithRepeatedFieldNoLock() const {
  Map<Key, T>* map = const_cast<MapField*>(this)->impl_.MutableMap();
  RepeatedPtrField<EntryType>* repeated_field =
      reinterpret_cast<RepeatedPtrField<EntryType>*>(
          this->MapFieldBase::repeated_field_);
  GOOGLE_CHECK(this->MapFieldBase::repeated_field_ != NULL);
  map->clear();
  for (typename RepeatedPtrField<EntryType>::iterator it =
           repeated_field->begin();
       it != repeated_field->end(); ++it) {
    // Cast is needed because Map's api and internal storage is different when
    // value is enum. For enum, we cannot cast an int to enum. Thus, we have to
    // copy value. For other types, they have same exposed api type and internal
    // stored type. We should not introduce value copy for them. We achieve this
    // by casting to value for enum while casting to reference for other types.
    (*map)[it->key()] = static_cast<CastValueType>(it->value());
  }
}